

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digraph.cc
# Opt level: O0

AdjVertex * __thiscall
bidirectional::DiGraph::getAdjVertex(DiGraph *this,LemonArc *arc,bool *forward)

{
  AdjVertex *this_00;
  byte *in_RCX;
  DiGraph *in_RSI;
  DiGraph *in_RDI;
  vector<double,_std::allocator<double>_> *resource_consumption;
  double *weight;
  Vertex *vertex;
  LemonNode node;
  DiGraph *this_01;
  Vertex local_40;
  Vertex *local_38;
  int local_2c;
  int local_28;
  Node local_24;
  byte *local_20;
  
  this_01 = in_RDI;
  local_20 = in_RCX;
  lemon::SmartDigraphBase::Node::Node(&local_24);
  if ((*local_20 & 1) == 0) {
    local_2c = (int)tail(in_RSI,(LemonArc *)this_01);
    local_24._id = local_2c;
  }
  else {
    local_28 = (int)head(in_RSI,(LemonArc *)this_01);
    local_24._id = local_28;
  }
  local_40 = getVertexFromLNode(in_RSI,(LemonNode *)this_01);
  local_38 = &local_40;
  getWeight(this_01,(LemonArc *)in_RDI);
  this_00 = (AdjVertex *)getRes(this_01,(LemonArc *)in_RDI);
  AdjVertex::AdjVertex
            (this_00,(Vertex *)in_RSI,(double *)this_01,
             (vector<double,_std::allocator<double>_> *)in_RDI);
  return (AdjVertex *)this_01;
}

Assistant:

AdjVertex DiGraph::getAdjVertex(const LemonArc& arc, const bool& forward)
    const {
  LemonNode node;
  if (forward) {
    node = head(arc);
  } else {
    node = tail(arc);
  }
  const Vertex&              vertex               = getVertexFromLNode(node);
  const double&              weight               = getWeight(arc);
  const std::vector<double>& resource_consumption = getRes(arc);
  return AdjVertex(vertex, weight, resource_consumption);
}